

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QMimeData * __thiscall QTableWidget::mimeData(QTableWidget *this,QList<QTableWidgetItem_*> *items)

{
  bool bVar1;
  QTableModel *pQVar2;
  const_iterator o;
  QList<QTableWidgetItem_*> *in_RSI;
  QTableWidget *in_RDI;
  long in_FS_OFFSET;
  QMimeData *result;
  QTableWidgetItem *item;
  QList<QTableWidgetItem_*> *__range2;
  QModelIndexList *cachedIndexes;
  QTableWidgetPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  rvalue_ref in_stack_ffffffffffffff68;
  QModelIndexList *in_stack_ffffffffffffff70;
  QTableWidgetItem *item_00;
  QList<QModelIndex> *in_stack_ffffffffffffff98;
  QMimeData *local_40;
  qsizetype in_stack_ffffffffffffffd8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTableWidget *)0x8dc6b5);
  pQVar2 = QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dc6d3);
  bVar1 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x8dc6e6);
  if (bVar1) {
    item_00 = (QTableWidgetItem *)&pQVar2->cachedIndexes;
    QList<QTableWidgetItem_*>::size(in_RSI);
    QList<QModelIndex>::reserve(in_stack_ffffffffffffff98,in_stack_ffffffffffffffd8);
    local_10.i = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QTableWidgetItem_*>::begin
                         ((QList<QTableWidgetItem_*> *)in_stack_ffffffffffffff70);
    o = QList<QTableWidgetItem_*>::end((QList<QTableWidgetItem_*> *)in_stack_ffffffffffffff70);
    while( true ) {
      bVar1 = QList<QTableWidgetItem_*>::const_iterator::operator!=(&local_10,o);
      if (!bVar1) break;
      QList<QTableWidgetItem_*>::const_iterator::operator*(&local_10);
      in_stack_ffffffffffffff70 = &pQVar2->cachedIndexes;
      indexFromItem(in_RDI,item_00);
      QList<QModelIndex>::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QList<QTableWidgetItem_*>::const_iterator::operator++(&local_10);
    }
    QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dc7eb);
    local_40 = QTableModel::internalMimeData((QTableModel *)0x8dc7f3);
    QList<QModelIndex>::clear(in_stack_ffffffffffffff70);
  }
  else {
    QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dc818);
    local_40 = QTableModel::internalMimeData((QTableModel *)0x8dc820);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTableWidget::mimeData(const QList<QTableWidgetItem *> &items) const
{
    Q_D(const QTableWidget);

    QModelIndexList &cachedIndexes = d->tableModel()->cachedIndexes;

    // if non empty, it's called from the model's own mimeData
    if (cachedIndexes.isEmpty()) {
        cachedIndexes.reserve(items.size());
        for (QTableWidgetItem *item : items)
            cachedIndexes << indexFromItem(item);

        QMimeData *result = d->tableModel()->internalMimeData();

        cachedIndexes.clear();
        return result;
    }

    return d->tableModel()->internalMimeData();
}